

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void cilk_fiber_tbb_interop_free_stack_op_info(void)

{
  __cilk_tbb_stack_op_thunk *p_Var1;
  __cilk_tbb_stack_op_thunk *saved_thunk;
  
  p_Var1 = __cilkrts_get_tls_tbb_interop();
  if (p_Var1 != (__cilk_tbb_stack_op_thunk *)0x0) {
    __cilkrts_free((void *)0x109afd);
    __cilkrts_set_tls_tbb_interop(saved_thunk);
  }
  return;
}

Assistant:

void cilk_fiber_tbb_interop_free_stack_op_info(void)
{
    __cilk_tbb_stack_op_thunk *saved_thunk =
        __cilkrts_get_tls_tbb_interop();

    // If we haven't allocated a TBB interop index, we don't have any saved info
    if (NULL == saved_thunk)
        return;

    DBG_STACK_OPS ("tbb_interop_free_stack_op_info - freeing saved info\n");

    // Free the memory and wipe out the TLS value
    __cilkrts_free(saved_thunk);
    __cilkrts_set_tls_tbb_interop(NULL);
}